

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseTranslator.cpp
# Opt level: O0

bool is_last_2_ay(string *str)

{
  int iVar1;
  string local_68 [36];
  undefined4 local_44;
  string local_40 [8];
  string end;
  int str_length;
  string *str_local;
  
  end.field_2._12_4_ = std::__cxx11::string::size();
  std::__cxx11::string::string(local_40);
  if ((int)end.field_2._12_4_ < 2) {
    str_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_68,(ulong)str);
    std::__cxx11::string::operator=(local_40,local_68);
    std::__cxx11::string::~string(local_68);
    iVar1 = std::__cxx11::string::compare((char *)local_40);
    str_local._7_1_ = iVar1 == 0;
  }
  local_44 = 1;
  std::__cxx11::string::~string(local_40);
  return str_local._7_1_;
}

Assistant:

bool is_last_2_ay(std::string str) {
  int str_length = str.size();
  std::string end;
  if (str_length < 2) {
    return false;
  }
  else {
    end = str.substr(str_length-2,2);
    return (end.compare("ay") == 0);
  }
}